

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5343ef::LaneBasedExecutionQueue::cancelAllJobs(LaneBasedExecutionQueue *this)

{
  mutex *__mutex;
  int iVar1;
  long *in_RAX;
  pointer __p;
  pthread_mutex_t *__mutex_00;
  pointer *__ptr;
  long *local_28;
  
  __mutex_00 = (pthread_mutex_t *)&this->readyJobsMutex;
  local_28 = in_RAX;
  iVar1 = pthread_mutex_lock(__mutex_00);
  if (iVar1 == 0) {
    __mutex = &(this->spawnedProcesses).mutex;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 == 0) {
      if (this->cancelled == false) {
        this->cancelled = true;
        (this->spawnedProcesses).closed = true;
        std::condition_variable::notify_all();
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_mutex_unlock(__mutex_00);
        llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,2);
        __mutex_00 = (pthread_mutex_t *)&this->killAfterTimeoutThreadMutex;
        iVar1 = pthread_mutex_lock(__mutex_00);
        if (iVar1 != 0) goto LAB_001c5238;
        __p = (pointer)operator_new(8);
        (__p->_M_id)._M_thread = 0;
        local_28 = (long *)operator_new(0x20);
        *local_28 = (long)&PTR___State_00244360;
        local_28[1] = (long)this;
        local_28[2] = (long)killAfterTimeout;
        local_28[3] = 0;
        std::thread::_M_start_thread(__p,&local_28,0);
        if (local_28 != (long *)0x0) {
          (**(code **)(*local_28 + 8))();
        }
        std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                  ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
                   &this->killAfterTimeoutThread,__p);
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      pthread_mutex_unlock(__mutex_00);
      return;
    }
  }
LAB_001c5238:
  std::__throw_system_error(iVar1);
}

Assistant:

virtual void cancelAllJobs() override {
    {
      std::lock_guard<std::mutex> lock(readyJobsMutex);
      std::lock_guard<std::mutex> guard(spawnedProcesses.mutex);
      if (cancelled) return;
      cancelled = true;
      spawnedProcesses.close();
      readyJobsCondition.notify_all();
    }

    spawnedProcesses.signalAll(SIGINT);
    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      killAfterTimeoutThread = llvm::make_unique<std::thread>(
          &LaneBasedExecutionQueue::killAfterTimeout, this);
    }
  }